

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O0

DeepSlice * __thiscall
Imf_2_5::TypedDeepImageChannel<half>::slice(TypedDeepImageChannel<half> *this)

{
  int iVar1;
  int iVar2;
  size_t yst;
  ImageChannel *in_RSI;
  DeepSlice *in_RDI;
  DeepSlice *unaff_retaddr;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined2 uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  ImageLevel *spst;
  undefined4 in_stack_ffffffffffffffe8;
  DeepSlice *b;
  ImageChannel *pIVar4;
  PixelType t;
  
  b = in_RDI;
  pIVar4 = in_RSI;
  iVar1 = (**in_RSI->_vptr_ImageChannel)();
  t = (PixelType)((ulong)pIVar4 >> 0x20);
  uVar3 = (undefined2)((ulong)in_RDI >> 0x30);
  spst = in_RSI[1]._level;
  iVar2 = ImageChannel::pixelsPerRow(in_RSI);
  yst = (long)iVar2 << 3;
  iVar2 = ImageChannel::xSampling(in_RSI);
  ImageChannel::ySampling(in_RSI);
  DeepSlice::DeepSlice
            (unaff_retaddr,t,(char *)b,CONCAT44(iVar2,in_stack_ffffffffffffffe8),yst,(size_t)spst,
             in_stack_00000010,in_stack_00000018,(double)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
             SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  return b;
}

Assistant:

DeepSlice
TypedDeepImageChannel<T>::slice () const
{
    return DeepSlice (pixelType(),                  // type
                      (char *) _base,               // base
                      sizeof (T*),                  // xStride
                      pixelsPerRow() * sizeof (T*), // yStride
                      sizeof (T),                   // sampleStride
                      xSampling(),
                      ySampling());
}